

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

ssize_t __thiscall embree::Device::getProperty(Device *this,RTCDeviceProperty prop)

{
  byte bVar1;
  int iVar2;
  RegressionTest *pRVar3;
  undefined8 *puVar4;
  allocator local_39;
  string local_38 [32];
  
  if (prop - 2000000 < 1000000) {
    pRVar3 = getRegressionTest((ulong)prop - 2000000);
    if (pRVar3 != (RegressionTest *)0x0) {
      return (ssize_t)(pRVar3->name)._M_dataplus._M_p;
    }
  }
  else if (prop - 3000000 < 1000000) {
    pRVar3 = getRegressionTest((ulong)prop - 3000000);
    if (pRVar3 != (RegressionTest *)0x0) {
      iVar2 = (**pRVar3->_vptr_RegressionTest)(pRVar3);
      bVar1 = (byte)iVar2;
LAB_00173063:
      return (ulong)bVar1;
    }
  }
  else {
    switch(prop) {
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_SPHERES_ENABLED:
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_CURVES_ENABLED:
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_ENABLED:
    case RTC_DEVICE_PROPERTY_IGNORE_INVALID_RAYS_ENABLED:
    case RTC_DEVICE_PROPERTY_COMPACT_POLYS_ENABLED:
      break;
    case RTC_DEVICE_PROPERTY_RAY_MASK_SUPPORTED:
    case RTC_DEVICE_PROPERTY_FILTER_FUNCTION_SUPPORTED:
LAB_00173173:
      return 1;
    default:
      switch(prop) {
      case RTC_DEVICE_PROPERTY_TRIANGLE_GEOMETRY_SUPPORTED:
      case RTC_DEVICE_PROPERTY_QUAD_GEOMETRY_SUPPORTED:
      case RTC_DEVICE_PROPERTY_SUBDIVISION_GEOMETRY_SUPPORTED:
      case RTC_DEVICE_PROPERTY_CURVE_GEOMETRY_SUPPORTED:
      case RTC_DEVICE_PROPERTY_USER_GEOMETRY_SUPPORTED:
      case RTC_DEVICE_PROPERTY_POINT_GEOMETRY_SUPPORTED:
        goto LAB_00173173;
      default:
        if (prop - RTC_DEVICE_PROPERTY_VERSION_MAJOR < 2) {
          return 4;
        }
        if (prop == RTC_DEVICE_PROPERTY_VERSION) {
          return 0x9dd0;
        }
        if (prop != RTC_DEVICE_PROPERTY_SYCL_DEVICE) {
          if (prop == RTC_DEVICE_PROPERTY_NATIVE_RAY4_SUPPORTED) {
            iVar2 = 0x2000003;
          }
          else if (prop == RTC_DEVICE_PROPERTY_NATIVE_RAY8_SUPPORTED) {
            iVar2 = 0x60000ff;
          }
          else {
            if (prop != RTC_DEVICE_PROPERTY_NATIVE_RAY16_SUPPORTED) {
              if (prop == RTC_DEVICE_PROPERTY_TASKING_SYSTEM) {
                return 1;
              }
              if (prop == RTC_DEVICE_PROPERTY_JOIN_COMMIT_SUPPORTED) {
                return 1;
              }
              if (prop == RTC_DEVICE_PROPERTY_PARALLEL_COMMIT_SUPPORTED) {
                return 1;
              }
              if (prop != RTC_DEVICE_PROPERTY_CPU_DEVICE) {
                if (prop == RTC_DEVICE_PROPERTY_VERSION_PATCH) {
                  return 0;
                }
                puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
                std::__cxx11::string::string(local_38,"unknown readable property",&local_39);
                *puVar4 = &PTR__rtcore_error_021d38e0;
                *(undefined4 *)(puVar4 + 1) = 2;
                std::__cxx11::string::string((string *)(puVar4 + 2),local_38);
                __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
              }
              return 1;
            }
            iVar2 = 0xe737dff;
          }
          bVar1 = State::hasISA(&this->super_State,iVar2);
          goto LAB_00173063;
        }
      }
    }
  }
  return 0;
}

Assistant:

ssize_t Device::getProperty(const RTCDeviceProperty prop)
  {
    size_t iprop = (size_t)prop;

    /* get name of internal regression test */
    if (iprop >= 2000000 && iprop < 3000000)
    {
      RegressionTest* test = getRegressionTest(iprop-2000000);
      if (test) return (ssize_t) test->name.c_str();
      else      return 0;
    }

    /* run internal regression test */
    if (iprop >= 3000000 && iprop < 4000000)
    {
      RegressionTest* test = getRegressionTest(iprop-3000000);
      if (test) return test->run();
      else      return 0;
    }

    /* documented properties */
    switch (prop) 
    {
    case RTC_DEVICE_PROPERTY_VERSION_MAJOR: return RTC_VERSION_MAJOR;
    case RTC_DEVICE_PROPERTY_VERSION_MINOR: return RTC_VERSION_MINOR;
    case RTC_DEVICE_PROPERTY_VERSION_PATCH: return RTC_VERSION_PATCH;
    case RTC_DEVICE_PROPERTY_VERSION      : return RTC_VERSION;

#if defined(EMBREE_TARGET_SIMD4) && defined(EMBREE_RAY_PACKETS)
    case RTC_DEVICE_PROPERTY_NATIVE_RAY4_SUPPORTED:  return hasISA(SSE2);
#else
    case RTC_DEVICE_PROPERTY_NATIVE_RAY4_SUPPORTED:  return 0;
#endif

#if defined(EMBREE_TARGET_SIMD8) && defined(EMBREE_RAY_PACKETS)
    case RTC_DEVICE_PROPERTY_NATIVE_RAY8_SUPPORTED:  return hasISA(AVX);
#else
    case RTC_DEVICE_PROPERTY_NATIVE_RAY8_SUPPORTED:  return 0;
#endif

#if defined(EMBREE_TARGET_SIMD16) && defined(EMBREE_RAY_PACKETS)
    case RTC_DEVICE_PROPERTY_NATIVE_RAY16_SUPPORTED: return hasISA(AVX512);
#else
    case RTC_DEVICE_PROPERTY_NATIVE_RAY16_SUPPORTED: return 0;
#endif

#if defined(EMBREE_RAY_MASK)
    case RTC_DEVICE_PROPERTY_RAY_MASK_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_RAY_MASK_SUPPORTED: return 0;
#endif

#if defined(EMBREE_BACKFACE_CULLING)
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_ENABLED: return 1;
#else
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_ENABLED: return 0;
#endif

#if defined(EMBREE_BACKFACE_CULLING_CURVES)
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_CURVES_ENABLED: return 1;
#else
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_CURVES_ENABLED: return 0;
#endif

#if defined(EMBREE_BACKFACE_CULLING_SPHERES)
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_SPHERES_ENABLED: return 1;
#else
    case RTC_DEVICE_PROPERTY_BACKFACE_CULLING_SPHERES_ENABLED: return 0;
#endif

#if defined(EMBREE_COMPACT_POLYS)
    case RTC_DEVICE_PROPERTY_COMPACT_POLYS_ENABLED: return 1;
#else
    case RTC_DEVICE_PROPERTY_COMPACT_POLYS_ENABLED: return 0;
#endif

#if defined(EMBREE_FILTER_FUNCTION)
    case RTC_DEVICE_PROPERTY_FILTER_FUNCTION_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_FILTER_FUNCTION_SUPPORTED: return 0;
#endif

#if defined(EMBREE_IGNORE_INVALID_RAYS)
    case RTC_DEVICE_PROPERTY_IGNORE_INVALID_RAYS_ENABLED: return 1;
#else
    case RTC_DEVICE_PROPERTY_IGNORE_INVALID_RAYS_ENABLED: return 0;
#endif

#if defined(TASKING_INTERNAL)
    case RTC_DEVICE_PROPERTY_TASKING_SYSTEM: return 0;
#endif

#if defined(TASKING_TBB)
    case RTC_DEVICE_PROPERTY_TASKING_SYSTEM: return 1;
#endif

#if defined(TASKING_PPL)
    case RTC_DEVICE_PROPERTY_TASKING_SYSTEM: return 2;
#endif

#if defined(EMBREE_GEOMETRY_TRIANGLE)
    case RTC_DEVICE_PROPERTY_TRIANGLE_GEOMETRY_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_TRIANGLE_GEOMETRY_SUPPORTED: return 0;
#endif
        
#if defined(EMBREE_GEOMETRY_QUAD)
    case RTC_DEVICE_PROPERTY_QUAD_GEOMETRY_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_QUAD_GEOMETRY_SUPPORTED: return 0;
#endif

#if defined(EMBREE_GEOMETRY_CURVE)
    case RTC_DEVICE_PROPERTY_CURVE_GEOMETRY_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_CURVE_GEOMETRY_SUPPORTED: return 0;
#endif

#if defined(EMBREE_GEOMETRY_SUBDIVISION)
    case RTC_DEVICE_PROPERTY_SUBDIVISION_GEOMETRY_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_SUBDIVISION_GEOMETRY_SUPPORTED: return 0;
#endif

#if defined(EMBREE_GEOMETRY_USER)
    case RTC_DEVICE_PROPERTY_USER_GEOMETRY_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_USER_GEOMETRY_SUPPORTED: return 0;
#endif

#if defined(EMBREE_GEOMETRY_POINT)
    case RTC_DEVICE_PROPERTY_POINT_GEOMETRY_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_POINT_GEOMETRY_SUPPORTED: return 0;
#endif

#if defined(TASKING_PPL)
    case RTC_DEVICE_PROPERTY_JOIN_COMMIT_SUPPORTED: return 0;
#elif defined(TASKING_TBB) && (TBB_INTERFACE_VERSION_MAJOR < 8)
    case RTC_DEVICE_PROPERTY_JOIN_COMMIT_SUPPORTED: return 0;
#else
    case RTC_DEVICE_PROPERTY_JOIN_COMMIT_SUPPORTED: return 1;
#endif

#if defined(TASKING_TBB) && TASKING_TBB_USE_TASK_ISOLATION
    case RTC_DEVICE_PROPERTY_PARALLEL_COMMIT_SUPPORTED: return 1;
#else
    case RTC_DEVICE_PROPERTY_PARALLEL_COMMIT_SUPPORTED: return 0;
#endif

#if defined(EMBREE_SYCL_SUPPORT)
    case RTC_DEVICE_PROPERTY_CPU_DEVICE:  {
      if (!dynamic_cast<DeviceGPU*>(this))
        return 1;
      return 0;
    };
    case RTC_DEVICE_PROPERTY_SYCL_DEVICE: {
      if (!dynamic_cast<DeviceGPU*>(this))
        return 0;
      return 1;
    };
#else
    case RTC_DEVICE_PROPERTY_CPU_DEVICE:  return 1;
    case RTC_DEVICE_PROPERTY_SYCL_DEVICE: return 0;
#endif

    default: throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown readable property"); break;
    };
  }